

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::create(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int idxmax)

{
  int iVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  int in_ESI;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  DLPSV *ps;
  int in_stack_ffffffffffffffcc;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *in_stack_ffffffffffffffd0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *elmem;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    local_c = 0;
  }
  iVar1 = memSize((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x69e5f0);
  if ((iVar1 == 0) && (local_c < 1)) {
    local_c = 1;
  }
  ensureMem((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)ps,in_stack_0000001c,in_stack_0000001b);
  memSize((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x69e621);
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize((ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  ensurePSVec(in_RDI,in_stack_ffffffffffffffdc);
  pNVar2 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::create(in_stack_ffffffffffffffd0);
  IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  ::append((IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            *)in_RDI,(DLPSV *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  elmem = pNVar2;
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::last(&in_RDI->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        );
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMem((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_RDI,local_c,elmem);
  return (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)pNVar2;
}

Assistant:

SVectorBase<R>* create(int idxmax = 0)
   {
      DLPSV* ps;

      if(idxmax < 0)
         idxmax = 0;

      if(memSize() == 0 && idxmax <= 0)
         idxmax = 1;

      ensureMem(idxmax);

      // resize the data array
#ifndef NDEBUG
      Nonzero<R>* olddata = SVSetBaseArray::data;
      SVSetBaseArray::reSize(memSize() + idxmax);
      assert(olddata == SVSetBaseArray::data);
#else
      SVSetBaseArray::reSize(memSize() + idxmax);
#endif

      ensurePSVec(1);
      ps = set.create();
      list.append(ps);

      ps->setMem(idxmax, &SVSetBaseArray::last() - idxmax + 1);

      return ps;
   }